

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive *prim;
  ulong uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  bool bVar23;
  undefined1 auVar24 [32];
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24d1;
  ulong local_24d0;
  ulong local_24c8;
  ulong local_24c0;
  RayHit *local_24b8;
  RayQueryContext *local_24b0;
  long local_24a8;
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar9;
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  pauVar22 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar28 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  aVar2 = (ray->super_RayK<1>).dir.field_0;
  auVar31._8_4_ = 0x7fffffff;
  auVar31._0_8_ = 0x7fffffff7fffffff;
  auVar31._12_4_ = 0x7fffffff;
  auVar31 = vandps_avx((undefined1  [16])aVar2,auVar31);
  auVar33._8_4_ = 0x219392ef;
  auVar33._0_8_ = 0x219392ef219392ef;
  auVar33._12_4_ = 0x219392ef;
  auVar31 = vcmpps_avx(auVar31,auVar33,1);
  auVar31 = vblendvps_avx((undefined1  [16])aVar2,auVar33,auVar31);
  auVar33 = vrcpps_avx(auVar31);
  auVar34._8_4_ = 0x3f800000;
  auVar34._0_8_ = 0x3f8000003f800000;
  auVar34._12_4_ = 0x3f800000;
  auVar31 = vfnmadd231ps_fma(auVar34,auVar33,auVar31);
  auVar30 = vfmadd132ps_fma(auVar31,auVar33,auVar33);
  local_2420 = auVar30._0_4_;
  fStack_241c = local_2420;
  fStack_2418 = local_2420;
  fStack_2414 = local_2420;
  fStack_2410 = local_2420;
  fStack_240c = local_2420;
  fStack_2408 = local_2420;
  fStack_2404 = local_2420;
  auVar31 = vmovshdup_avx(auVar30);
  local_2440 = auVar31._0_8_;
  uStack_2438 = local_2440;
  uStack_2430 = local_2440;
  uStack_2428 = local_2440;
  auVar34 = vshufpd_avx(auVar30,auVar30,1);
  auVar33 = vshufps_avx(auVar30,auVar30,0xaa);
  local_2460 = auVar33._0_8_;
  uStack_2458 = local_2460;
  uStack_2450 = local_2460;
  uStack_2448 = local_2460;
  auVar35._0_4_ = local_2420 * (ray->super_RayK<1>).org.field_0.m128[0];
  auVar35._4_4_ = auVar30._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
  auVar35._8_4_ = auVar30._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
  auVar35._12_4_ = auVar30._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
  auVar33 = vmovshdup_avx(auVar35);
  auVar30 = vshufps_avx(auVar35,auVar35,0xaa);
  uVar16 = (ulong)(local_2420 < 0.0) << 5;
  uVar17 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x40;
  uVar18 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
  uVar20 = uVar16 ^ 0x20;
  uVar14 = uVar17 ^ 0x20;
  uVar21 = uVar18 ^ 0x20;
  auVar24._0_4_ = auVar28._0_4_;
  auVar24._4_4_ = auVar24._0_4_;
  auVar24._8_4_ = auVar24._0_4_;
  auVar24._12_4_ = auVar24._0_4_;
  auVar24._16_4_ = auVar24._0_4_;
  auVar24._20_4_ = auVar24._0_4_;
  auVar24._24_4_ = auVar24._0_4_;
  auVar24._28_4_ = auVar24._0_4_;
  local_2480 = -auVar35._0_4_;
  fStack_247c = -auVar35._0_4_;
  fStack_2478 = -auVar35._0_4_;
  fStack_2474 = -auVar35._0_4_;
  fStack_2470 = -auVar35._0_4_;
  fStack_246c = -auVar35._0_4_;
  fStack_2468 = -auVar35._0_4_;
  fStack_2464 = -auVar35._0_4_;
  uVar8 = auVar33._0_4_;
  uVar29 = auVar33._4_4_;
  local_23c0._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
  local_23c0._8_4_ = uVar8 ^ 0x80000000;
  local_23c0._12_4_ = uVar29 ^ 0x80000000;
  local_23c0._16_4_ = uVar8 ^ 0x80000000;
  local_23c0._20_4_ = uVar29 ^ 0x80000000;
  local_23c0._24_4_ = uVar8 ^ 0x80000000;
  local_23c0._28_4_ = uVar29 ^ 0x80000000;
  auVar40 = ZEXT3264(local_23c0);
  uVar8 = auVar30._0_4_;
  uVar29 = auVar30._4_4_;
  local_23e0._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
  local_23e0._8_4_ = uVar8 ^ 0x80000000;
  local_23e0._12_4_ = uVar29 ^ 0x80000000;
  local_23e0._16_4_ = uVar8 ^ 0x80000000;
  local_23e0._20_4_ = uVar29 ^ 0x80000000;
  local_23e0._24_4_ = uVar8 ^ 0x80000000;
  local_23e0._28_4_ = uVar29 ^ 0x80000000;
  auVar41 = ZEXT3264(local_23e0);
  uVar25 = auVar26._0_4_;
  local_2400._4_4_ = uVar25;
  local_2400._0_4_ = uVar25;
  local_2400._8_4_ = uVar25;
  local_2400._12_4_ = uVar25;
  local_2400._16_4_ = uVar25;
  local_2400._20_4_ = uVar25;
  local_2400._24_4_ = uVar25;
  local_2400._28_4_ = uVar25;
  auVar42 = ZEXT3264(local_2400);
  local_24d0 = uVar18;
  local_24c8 = uVar17;
  local_24c0 = uVar16;
  local_24b8 = ray;
  local_24b0 = context;
  do {
    auVar39 = ZEXT3264(CONCAT428(fStack_2404,
                                 CONCAT424(fStack_2408,
                                           CONCAT420(fStack_240c,
                                                     CONCAT416(fStack_2410,
                                                               CONCAT412(fStack_2414,
                                                                         CONCAT48(fStack_2418,
                                                                                  CONCAT44(
                                                  fStack_241c,local_2420))))))));
    auVar38 = ZEXT3264(CONCAT824(uStack_2428,CONCAT816(uStack_2430,CONCAT88(uStack_2438,local_2440))
                                ));
    auVar32 = ZEXT3264(CONCAT824(uStack_2448,CONCAT816(uStack_2450,CONCAT88(uStack_2458,local_2460))
                                ));
    auVar37 = ZEXT3264(CONCAT428(fStack_2464,
                                 CONCAT424(fStack_2468,
                                           CONCAT420(fStack_246c,
                                                     CONCAT416(fStack_2470,
                                                               CONCAT412(fStack_2474,
                                                                         CONCAT48(fStack_2478,
                                                                                  CONCAT44(
                                                  fStack_247c,local_2480))))))));
LAB_015354e2:
    do {
      if (pauVar22 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar11 = pauVar22 + -1;
      pauVar22 = pauVar22 + -1;
    } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar11 + 8));
    uVar12 = *(ulong *)*pauVar22;
LAB_01535507:
    if ((uVar12 & 8) == 0) {
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar12 + 0x40 + uVar16),auVar37._0_32_,
                                auVar39._0_32_);
      auVar26 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar12 + 0x40 + uVar17),auVar40._0_32_,
                                auVar38._0_32_);
      auVar4 = vpmaxsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar26));
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar12 + 0x40 + uVar18),auVar41._0_32_,
                                auVar32._0_32_);
      auVar5 = vpmaxsd_avx2(ZEXT1632(auVar31),auVar42._0_32_);
      local_24a0 = vpmaxsd_avx2(auVar4,auVar5);
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar12 + 0x40 + uVar20),auVar37._0_32_,
                                auVar39._0_32_);
      auVar26 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar12 + 0x40 + uVar14),auVar40._0_32_,
                                auVar38._0_32_);
      auVar4 = vpminsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar26));
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar12 + 0x40 + uVar21),auVar41._0_32_,
                                auVar32._0_32_);
      auVar5 = vpminsd_avx2(ZEXT1632(auVar31),auVar24);
      auVar4 = vpminsd_avx2(auVar4,auVar5);
      auVar4 = vpcmpgtd_avx2(local_24a0,auVar4);
      iVar7 = vmovmskps_avx(auVar4);
      if (iVar7 != 0xff) {
        bVar6 = ~(byte)iVar7;
        uVar19 = uVar12 & 0xfffffffffffffff0;
        lVar13 = 0;
        for (uVar12 = (ulong)bVar6; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        uVar12 = *(ulong *)(uVar19 + lVar13 * 8);
        uVar8 = bVar6 - 1 & (uint)bVar6;
        uVar9 = (ulong)uVar8;
        if (uVar8 != 0) {
          uVar29 = *(uint *)(local_24a0 + lVar13 * 4);
          lVar13 = 0;
          for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar8 = uVar8 - 1 & uVar8;
          uVar10 = (ulong)uVar8;
          uVar9 = *(ulong *)(uVar19 + lVar13 * 8);
          uVar3 = *(uint *)(local_24a0 + lVar13 * 4);
          if (uVar8 == 0) {
            if (uVar29 < uVar3) {
              *(ulong *)*pauVar22 = uVar9;
              *(uint *)(*pauVar22 + 8) = uVar3;
              pauVar22 = pauVar22 + 1;
            }
            else {
              *(ulong *)*pauVar22 = uVar12;
              *(uint *)(*pauVar22 + 8) = uVar29;
              uVar12 = uVar9;
              pauVar22 = pauVar22 + 1;
            }
          }
          else {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar12;
            auVar31 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar29));
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar9;
            auVar26 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar3));
            lVar13 = 0;
            for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar8 = uVar8 - 1 & uVar8;
            uVar12 = (ulong)uVar8;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)(uVar19 + lVar13 * 8);
            auVar33 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_24a0 + lVar13 * 4)));
            auVar28 = vpcmpgtd_avx(auVar26,auVar31);
            if (uVar8 == 0) {
              auVar34 = vpshufd_avx(auVar28,0xaa);
              auVar28 = vblendvps_avx(auVar26,auVar31,auVar34);
              auVar31 = vblendvps_avx(auVar31,auVar26,auVar34);
              auVar26 = vpcmpgtd_avx(auVar33,auVar28);
              auVar34 = vpshufd_avx(auVar26,0xaa);
              auVar26 = vblendvps_avx(auVar33,auVar28,auVar34);
              auVar28 = vblendvps_avx(auVar28,auVar33,auVar34);
              auVar33 = vpcmpgtd_avx(auVar28,auVar31);
              auVar34 = vpshufd_avx(auVar33,0xaa);
              auVar33 = vblendvps_avx(auVar28,auVar31,auVar34);
              auVar31 = vblendvps_avx(auVar31,auVar28,auVar34);
              *pauVar22 = auVar31;
              pauVar22[1] = auVar33;
              uVar12 = auVar26._0_8_;
              pauVar11 = pauVar22 + 2;
            }
            else {
              lVar13 = 0;
              for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                lVar13 = lVar13 + 1;
              }
              uVar8 = uVar8 - 1 & uVar8;
              uVar12 = (ulong)uVar8;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)(uVar19 + lVar13 * 8);
              auVar34 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_24a0 + lVar13 * 4)));
              if (uVar8 == 0) {
                auVar30 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar26,auVar31,auVar30);
                auVar31 = vblendvps_avx(auVar31,auVar26,auVar30);
                auVar26 = vpcmpgtd_avx(auVar34,auVar33);
                auVar30 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar34,auVar33,auVar30);
                auVar33 = vblendvps_avx(auVar33,auVar34,auVar30);
                auVar34 = vpcmpgtd_avx(auVar33,auVar31);
                auVar30 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar33,auVar31,auVar30);
                auVar31 = vblendvps_avx(auVar31,auVar33,auVar30);
                auVar33 = vpcmpgtd_avx(auVar26,auVar28);
                auVar30 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar26,auVar28,auVar30);
                auVar26 = vblendvps_avx(auVar28,auVar26,auVar30);
                auVar28 = vpcmpgtd_avx(auVar34,auVar26);
                auVar30 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar34,auVar26,auVar30);
                auVar26 = vblendvps_avx(auVar26,auVar34,auVar30);
                *pauVar22 = auVar31;
                pauVar22[1] = auVar26;
                pauVar22[2] = auVar28;
                uVar12 = auVar33._0_8_;
                pauVar11 = pauVar22 + 3;
              }
              else {
                *pauVar22 = auVar31;
                pauVar22[1] = auVar26;
                pauVar22[2] = auVar33;
                pauVar11 = pauVar22 + 3;
                pauVar22[3] = auVar34;
                do {
                  lVar13 = 0;
                  for (uVar9 = uVar12; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                    lVar13 = lVar13 + 1;
                  }
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = *(ulong *)(uVar19 + lVar13 * 8);
                  auVar31 = vpunpcklqdq_avx(auVar27,ZEXT416(*(uint *)(local_24a0 + lVar13 * 4)));
                  pauVar11[1] = auVar31;
                  pauVar11 = pauVar11 + 1;
                  uVar12 = uVar12 - 1 & uVar12;
                } while (uVar12 != 0);
                lVar13 = 0;
                while (pauVar11 != pauVar22) {
                  auVar31 = pauVar22[1];
                  uVar8 = vextractps_avx(auVar31,2);
                  for (lVar15 = 0x10;
                      (lVar13 != lVar15 && (*(uint *)(pauVar22[-1] + lVar15 + 8) < uVar8));
                      lVar15 = lVar15 + -0x10) {
                    *(undefined1 (*) [16])(*pauVar22 + lVar15) =
                         *(undefined1 (*) [16])(pauVar22[-1] + lVar15);
                  }
                  *(undefined1 (*) [16])(*pauVar22 + lVar15) = auVar31;
                  lVar13 = lVar13 + -0x10;
                  pauVar22 = pauVar22 + 1;
                }
                uVar12 = *(ulong *)*pauVar11;
                auVar39 = ZEXT3264(CONCAT428(fStack_2404,
                                             CONCAT424(fStack_2408,
                                                       CONCAT420(fStack_240c,
                                                                 CONCAT416(fStack_2410,
                                                                           CONCAT412(fStack_2414,
                                                                                     CONCAT48(
                                                  fStack_2418,CONCAT44(fStack_241c,local_2420)))))))
                                  );
              }
              auVar38 = ZEXT3264(CONCAT824(uStack_2428,
                                           CONCAT816(uStack_2430,CONCAT88(uStack_2438,local_2440))))
              ;
            }
            auVar32 = ZEXT3264(CONCAT824(uStack_2448,
                                         CONCAT816(uStack_2450,CONCAT88(uStack_2458,local_2460))));
            auVar37 = ZEXT3264(CONCAT428(fStack_2464,
                                         CONCAT424(fStack_2468,
                                                   CONCAT420(fStack_246c,
                                                             CONCAT416(fStack_2470,
                                                                       CONCAT412(fStack_2474,
                                                                                 CONCAT48(
                                                  fStack_2478,CONCAT44(fStack_247c,local_2480)))))))
                              );
            pauVar22 = pauVar11;
          }
        }
        goto LAB_01535507;
      }
      goto LAB_015354e2;
    }
    local_24a8 = (ulong)((uint)uVar12 & 0xf) - 8;
    prim = (Primitive *)(uVar12 & 0xfffffffffffffff0);
    while (bVar23 = local_24a8 != 0, local_24a8 = local_24a8 + -1, bVar23) {
      InstanceArrayIntersector1::intersect(&local_24d1,ray,local_24b0,prim);
      auVar42 = ZEXT3264(local_2400);
      auVar41 = ZEXT3264(local_23e0);
      auVar40 = ZEXT3264(local_23c0);
      prim = prim + 1;
      ray = local_24b8;
      uVar16 = local_24c0;
      uVar17 = local_24c8;
      uVar18 = local_24d0;
    }
    fVar1 = (ray->super_RayK<1>).tfar;
    auVar24._4_4_ = fVar1;
    auVar24._0_4_ = fVar1;
    auVar24._8_4_ = fVar1;
    auVar24._12_4_ = fVar1;
    auVar24._16_4_ = fVar1;
    auVar24._20_4_ = fVar1;
    auVar24._24_4_ = fVar1;
    auVar24._28_4_ = fVar1;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }